

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoGenericBoxed.cpp
# Opt level: O3

void __thiscall
chrono::ChConstraintTwoGenericBoxed::ArchiveIN
          (ChConstraintTwoGenericBoxed *this,ChArchiveIn *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChConstraintTwoGenericBoxed>(marchive);
  ChConstraintTwoGeneric::ArchiveIN(&this->super_ChConstraintTwoGeneric,marchive);
  local_30 = &this->l_min;
  local_38 = "l_min";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->l_max;
  local_38 = "l_max";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  return;
}

Assistant:

void ChConstraintTwoGenericBoxed::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChConstraintTwoGenericBoxed>();

    // deserialize the parent class data too
    ChConstraintTwoGeneric::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(l_min);
    marchive >> CHNVP(l_max);
}